

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O3

RealCanvas<plot::BrailleCanvas> * __thiscall
plot::RealCanvas<plot::BrailleCanvas>::stroke<std::pair<float,float>(&)(float,float)>
          (RealCanvas<plot::BrailleCanvas> *this,Color *color,Rectf *rct,
          _func_pair<float,_float>_float_float *fn)

{
  Rect rct_00;
  point_type pVar1;
  point_type pVar2;
  long local_50;
  long lStack_48;
  anon_class_16_2_e8808043 local_40;
  
  pVar1 = map(this,&rct->p1);
  pVar2 = map(this,&rct->p2);
  local_50 = pVar2.x;
  lStack_48 = pVar2.y;
  rct_00.p2.x = local_50;
  rct_00.p1.x = pVar1.x;
  rct_00.p1.y = pVar1.y;
  rct_00.p2.y = lStack_48;
  local_40.this = this;
  local_40.fn = fn;
  BrailleCanvas::
  stroke<plot::RealCanvas<plot::BrailleCanvas>::stroke<std::pair<float,float>(&)(float,float)>(plot::Color_const&,plot::GenericRect<float>const&,std::pair<float,float>(&)(float,float))::_lambda(long)_1_>
            (&this->canvas_,color,rct_00,&local_40,Over);
  return this;
}

Assistant:

RealCanvas& stroke(Color const& color, Rectf const& rct, Fn&& fn, Args&&... args) {
        canvas_.stroke(color, map(rct), [this,&fn](typename Canvas::coord_type x) {
            auto real_bounds = fn(unmap(Point(x, 0)).x, unmap(Point(x + 1, 0)).x);
            auto base = map(Pointf(0, real_bounds.first)).y,
                 end = map(Pointf(0, real_bounds.second)).y;
            return (base != end) ? std::make_pair(base, end)
                                 : std::make_pair(base, base+1);
        }, std::forward<Args>(args)...);
        return *this;
    }